

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printVectorListOneAllLanes(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint8_t uVar3;
  uint uVar4;
  MCOperand *pMVar5;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint8_t access;
  cs_struct *s;
  SStream *in_stack_ffffffffffffffd0;
  SStream *ss;
  cs_struct *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  s = in_RDI->csh;
  MCInst_getOpcode(in_RDI);
  uVar3 = get_op_access(in_stack_ffffffffffffffd8,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                        (uint)in_stack_ffffffffffffffd0);
  SStream_concat0(in_stack_ffffffffffffffd0,(char *)s);
  ss = (SStream *)in_RDI->csh;
  pMVar5 = MCInst_getOperand(in_RDI,in_ESI);
  MCOperand_getReg(pMVar5);
  printRegName((cs_struct *)CONCAT17(uVar3,in_stack_ffffffffffffffe0),in_RDX,
               (uint)((ulong)ss >> 0x20));
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pMVar5 = MCInst_getOperand(in_RDI,in_ESI);
    uVar4 = MCOperand_getReg(pMVar5);
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar4;
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] = uVar3;
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  SStream_concat0(ss,(char *)s);
  in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
  return;
}

Assistant:

static void printVectorListOneAllLanes(MCInst *MI, unsigned OpNum, SStream *O)
{
#ifndef CAPSTONE_DIET
	uint8_t access;

	access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
#endif

	SStream_concat0(O, "{");
	printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, OpNum)));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, OpNum));
#ifndef CAPSTONE_DIET
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
#endif
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, "[]}");

#ifndef CAPSTONE_DIET
	MI->ac_idx++;
#endif
}